

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalPdu.cpp
# Opt level: O0

void __thiscall DIS::SignalPdu::unmarshal(SignalPdu *this,DataStream *dataStream)

{
  uchar local_21;
  int local_20;
  int iStack_1c;
  uint8_t x;
  int idx;
  int dataLengthBytes;
  DataStream *dataStream_local;
  SignalPdu *this_local;
  
  _idx = dataStream;
  dataStream_local = (DataStream *)this;
  RadioCommunicationsFamilyPdu::unmarshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator>>
            (_idx,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator>>
            (_idx,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2c);
  DataStream::operator>>(_idx,&this->_sampleRate);
  DataStream::operator>>(_idx,&this->_dataLength);
  DataStream::operator>>(_idx,&this->_samples);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_data);
  iStack_1c = (this->_dataLength + 7) / 8;
  for (local_20 = 0; local_20 < iStack_1c; local_20 = local_20 + 1) {
    DataStream::operator>>(_idx,&local_21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->_data,&local_21);
  }
  return;
}

Assistant:

void SignalPdu::unmarshal(DataStream &dataStream)
{
  RadioCommunicationsFamilyPdu::unmarshal(
      dataStream); // unmarshal information in superclass first
  dataStream >> _encodingScheme;
  dataStream >> _tdlType;
  dataStream >> _sampleRate;
  dataStream >> _dataLength;
  dataStream >> _samples;

  _data.clear();
  const int dataLengthBytes = (_dataLength + 7) / 8; // bits to bytes
  for (auto idx = 0; idx < dataLengthBytes; ++idx)
  {
    uint8_t x;
    dataStream >> x;
    _data.push_back(x);
  }
}